

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_PlayerInSpecialSector(player_t *player,sector_t *sector)

{
  APlayerPawn *this;
  AActor *pAVar1;
  sector_t *sec;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double checkz;
  DVector3 local_48;
  TAngle<double> local_30;
  FName local_24;
  AInventory *local_20;
  AInventory *ironfeet;
  sector_t *sector_local;
  player_t *player_local;
  
  ironfeet = (AInventory *)sector;
  sector_local = (sector_t *)player;
  if (sector == (sector_t *)0x0) {
    ironfeet = (AInventory *)(player->mo->super_AActor).Sector;
    this = player->mo;
    checkz = sector_t::LowestFloorAt
                       ((sector_t *)ironfeet,&player->mo->super_AActor,(sector_t **)0x0);
    bVar2 = AActor::isAtZ(&this->super_AActor,checkz);
    if ((!bVar2) && (*(int *)((long)sector_local->planes[0].xform.xOffs + 0x2d0) == 0)) {
      return;
    }
  }
  if (*(int *)&(ironfeet->super_AActor).field_0x1e4 < 1) {
    if ((*(int *)&(ironfeet->super_AActor).field_0x1e4 < 0) &&
       (level.time % (int)*(short *)&(ironfeet->super_AActor).specialf1 == 0)) {
      P_GiveBody((AActor *)sector_local->planes[0].xform.xOffs,
                 -*(int *)&(ironfeet->super_AActor).field_0x1e4,100);
    }
  }
  else {
    local_20 = TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)((long)sector_local->planes[0].xform.xOffs + 0x3b0));
    while ((local_20 != (AInventory *)0x0 &&
           (bVar2 = DObject::IsKindOf((DObject *)local_20,APowerIronFeet::RegistrationInfo.MyClass),
           !bVar2))) {
      local_20 = TObjPtr::operator_cast_to_AInventory_
                           ((TObjPtr *)&(local_20->super_AActor).Inventory);
    }
    if (((ulong)(ironfeet->super_AActor).specialf2 & 0x100) != 0) {
      *(uint *)&(sector_local->ceilingplane).normal.Z =
           *(uint *)&(sector_local->ceilingplane).normal.Z & 0xfffffffd;
    }
    if ((local_20 == (AInventory *)0x0) ||
       (iVar3 = FRandom::operator()(&pr_playerinspecialsector),
       iVar3 < *(short *)((long)&(ironfeet->super_AActor).specialf1 + 2))) {
      if (((ulong)(ironfeet->super_AActor).specialf2 & 0x400) == 0) {
        if (level.time % (int)*(short *)&(ironfeet->super_AActor).specialf1 == 0) {
          if (((ulong)(sector_local->ceilingplane).normal.Z & 0x2000002) == 0) {
            pAVar1 = (AActor *)sector_local->planes[0].xform.xOffs;
            iVar3 = *(int *)&(ironfeet->super_AActor).field_0x1e4;
            FName::FName(&local_24,(FName *)&(ironfeet->super_AActor).special2);
            TAngle<double>::TAngle(&local_30,0.0);
            P_DamageMobj(pAVar1,(AActor *)0x0,(AActor *)0x0,iVar3,&local_24,0,&local_30);
          }
          if (((((ulong)(ironfeet->super_AActor).specialf2 & 0x200) != 0) &&
              (*(int *)&sector_local->planes[1].alpha < 0xb)) &&
             ((iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 == 0 ||
              (uVar4 = FIntCVar::operator_cast_to_int(&dmflags), (uVar4 & 0x400) == 0)))) {
            G_ExitLevel(0,false);
          }
          if (((ulong)(ironfeet->super_AActor).specialf2 & 0x80) != 0) {
            pAVar1 = (AActor *)sector_local->planes[0].xform.xOffs;
            sec = *(sector_t **)((long)sector_local->planes[0].xform.xOffs + 0x130);
            AActor::Pos(&local_48,(AActor *)sector_local->planes[0].xform.xOffs);
            P_HitWater(pAVar1,sec,&local_48,false,true,true);
          }
        }
      }
      else {
        *(int *)((long)&(sector_local->SoundTarget).field_0 + 4) =
             *(int *)&(ironfeet->super_AActor).field_0x1e4 +
             *(int *)((long)&(sector_local->SoundTarget).field_0 + 4);
        FName::operator=((FName *)&sector_local->seqType,(FName *)&(ironfeet->super_AActor).special2
                        );
        iVar3 = (int)*(short *)&(ironfeet->super_AActor).specialf1;
        sector_local->special = (short)iVar3;
        sector_local->lightlevel = (short)((uint)iVar3 >> 0x10);
      }
    }
  }
  bVar2 = sector_t::isSecret((sector_t *)ironfeet);
  if (bVar2) {
    sector_t::ClearSecret((sector_t *)ironfeet);
    P_GiveSecret((AActor *)sector_local->planes[0].xform.xOffs,true,true,
                 (int)(((long)ironfeet - (long)sectors) / 0x218));
  }
  return;
}

Assistant:

void P_PlayerInSpecialSector (player_t *player, sector_t * sector)
{
	if (sector == NULL)
	{
		// Falling, not all the way down yet?
		sector = player->mo->Sector;
		if (!player->mo->isAtZ(sector->LowestFloorAt(player->mo))
			&& !player->mo->waterlevel)
		{
			return;
		}
	}

	// Has hit ground.
	AInventory *ironfeet;

	// [RH] Apply any customizable damage
	if (sector->damageamount > 0)
	{
		// Allow subclasses. Better would be to implement it as armor and let that reduce
		// the damage as part of the normal damage procedure. Unfortunately, I don't have
		// different damage types yet, so that's not happening for now.
		for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
		{
			if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
				break;
		}

		if (sector->Flags & SECF_ENDGODMODE) player->cheats &= ~CF_GODMODE;
		if ((ironfeet == NULL || pr_playerinspecialsector() < sector->leakydamage))
		{
			if (sector->Flags & SECF_HAZARD)
			{
				player->hazardcount += sector->damageamount;
				player->hazardtype = sector->damagetype;
				player->hazardinterval = sector->damageinterval;
			}
			else if (level.time % sector->damageinterval == 0)
			{
				if (!(player->cheats & (CF_GODMODE|CF_GODMODE2))) P_DamageMobj(player->mo, NULL, NULL, sector->damageamount, sector->damagetype);
				if ((sector->Flags & SECF_ENDLEVEL) && player->health <= 10 && (!deathmatch || !(dmflags & DF_NO_EXIT)))
				{
					G_ExitLevel(0, false);
				}
				if (sector->Flags & SECF_DMGTERRAINFX)
				{
					P_HitWater(player->mo, player->mo->Sector, player->mo->Pos(), false, true, true);
				}
			}
		}
	}
	else if (sector->damageamount < 0)
	{
		if (level.time % sector->damageinterval == 0)
		{
			P_GiveBody(player->mo, -sector->damageamount, 100);
		}
	}

	if (sector->isSecret())
	{
		sector->ClearSecret();
		P_GiveSecret(player->mo, true, true, int(sector - sectors));
	}
}